

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

Gia_Man_t *
Gia_ManFindExact(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int nBTLimit,
                int nStartGates,int fVerbose)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  Ses_Man_t *pSes;
  char *__ptr;
  Gia_Man_t *p;
  char *pcVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Ptr_t *vNames;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  byte *pbVar22;
  int iVar23;
  long local_58;
  timespec ts;
  
  if (6 < nVars - 2U) {
    __assert_fail("nVars >= 2 && nVars <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x99a,"Gia_Man_t *Gia_ManFindExact(word *, int, int, int, int *, int, int, int)")
    ;
  }
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    local_58 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_58 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  pSes = Ses_ManAlloc(pTruth,nVars,nFunc,nMaxDepth,pArrTimeProfile,1,nBTLimit,fVerbose);
  pSes->nStartGates = nStartGates;
  pSes->fVeryVerbose = 1;
  pSes->fExtractVerbose = 0;
  pSes->fSatVerbose = 0;
  pSes->fReasonVerbose = 1;
  if (fVerbose != 0) {
    Ses_ManPrintFuncs(pSes);
  }
  __ptr = Ses_ManFindMinimumSize(pSes);
  piVar7 = (int *)0x0;
  if (__ptr == (char *)0x0) {
    p = (Gia_Man_t *)0x0;
  }
  else {
    p = Gia_ManStart((int)__ptr[1] + (int)__ptr[2] + (int)*__ptr + 1);
    p->nConstrs = 0;
    pcVar6 = Extra_UtilStrsav("exact");
    p->pName = pcVar6;
    iVar23 = (int)*__ptr;
    cVar1 = __ptr[2];
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar4 = 0x10;
    if (0xe < (cVar1 + iVar23) - 1U) {
      iVar4 = cVar1 + iVar23;
    }
    p_00->nSize = 0;
    p_00->nCap = iVar4;
    if (iVar4 != 0) {
      piVar7 = (int *)malloc((long)iVar4 << 2);
    }
    p_00->pArray = piVar7;
    vNames = Abc_NodeGetFakeNames(__ptr[1] + iVar23);
    iVar23 = (int)*__ptr;
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = 8;
    if (6 < iVar23 - 1U) {
      iVar4 = iVar23;
    }
    pVVar8->nSize = 0;
    pVVar8->nCap = iVar4;
    if (iVar4 == 0) {
      ppvVar9 = (void **)0x0;
    }
    else {
      ppvVar9 = (void **)malloc((long)iVar4 << 3);
    }
    pVVar8->pArray = ppvVar9;
    pVVar8->nSize = iVar23;
    memset(ppvVar9,0,(long)iVar23 << 3);
    p->vNamesIn = pVVar8;
    if ('\0' < *__ptr) {
      lVar17 = 0;
      do {
        pGVar10 = Gia_ManAppendObj(p);
        uVar12 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20
        ;
        pGVar11 = p->pObjs;
        if ((pGVar10 < pGVar11) || (pGVar11 + p->nObjs <= pGVar10)) goto LAB_002bd716;
        Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2) * -0x55555555);
        pGVar11 = p->pObjs;
        if ((pGVar10 < pGVar11) || (pGVar11 + p->nObjs <= pGVar10)) goto LAB_002bd716;
        Vec_IntPush(p_00,(int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2) * 0x55555556);
        if (vNames->nSize <= lVar17) goto LAB_002bd754;
        pVVar8 = p->vNamesIn;
        pcVar6 = Extra_UtilStrsav((char *)vNames->pArray[lVar17]);
        Vec_PtrSetEntry(pVVar8,(int)lVar17,pcVar6);
        lVar17 = lVar17 + 1;
      } while (lVar17 < *__ptr);
    }
    pbVar22 = (byte *)(__ptr + 3);
    if ('\0' < __ptr[2]) {
      iVar4 = 0;
      do {
        if (pbVar22[1] != 2) {
          __assert_fail("p[1] == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                        ,0x73f,"Gia_Man_t *Ses_ManExtractGia(const char *)");
        }
        bVar2 = pbVar22[2];
        if (((((char)bVar2 < '\0') || (p_00->nSize <= (int)(char)bVar2)) ||
            (bVar3 = pbVar22[3], (char)bVar3 < '\0')) || (p_00->nSize <= (int)(char)bVar3))
        goto LAB_002bd735;
        uVar21 = p_00->pArray[(uint)(int)(char)bVar2];
        uVar18 = p_00->pArray[(uint)(int)(char)bVar3];
        bVar2 = *pbVar22;
        if ((bVar2 & 1) != 0) {
          if ((int)uVar21 < 0) goto LAB_002bd7b1;
          uVar21 = uVar21 ^ 1;
        }
        if ((bVar2 & 2) != 0) {
          if ((int)uVar18 < 0) goto LAB_002bd7b1;
          uVar18 = uVar18 ^ 1;
        }
        pGVar11 = Gia_ManAppendObj(p);
        if ((int)uVar21 < 0) {
LAB_002bd792:
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar13 = uVar21 >> 1;
        iVar23 = p->nObjs;
        if (iVar23 <= (int)uVar13) goto LAB_002bd792;
        if (((int)uVar18 < 0) || (uVar5 = uVar18 >> 1, iVar23 <= (int)uVar5)) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if ((uVar13 == uVar5) && (p->fGiaSimple == 0)) {
          __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        pGVar10 = p->pObjs;
        iVar16 = (int)pGVar11;
        if ((int)uVar21 < (int)uVar18) {
          if (pGVar10 + iVar23 <= pGVar11 || pGVar11 < pGVar10) goto LAB_002bd716;
          uVar12 = *(ulong *)pGVar11;
          uVar15 = (ulong)((uVar21 & 1) << 0x1d |
                          ((uint)(iVar16 - (int)pGVar10) >> 2) * -0x55555555 - uVar13 & 0x1fffffff);
          *(ulong *)pGVar11 = uVar15 | uVar12 & 0xffffffffc0000000;
          pGVar10 = p->pObjs;
          if ((pGVar11 < pGVar10) || (pGVar10 + p->nObjs <= pGVar11)) goto LAB_002bd716;
          uVar14 = (ulong)(((uint)(iVar16 - (int)pGVar10) >> 2) * -0x55555555 - uVar5 & 0x1fffffff)
                   << 0x20;
          *(ulong *)pGVar11 = uVar15 | uVar12 & 0xe0000000c0000000 | uVar14;
          uVar19 = (ulong)(uVar18 & 1) << 0x3d;
          uVar14 = uVar15 | uVar12 & 0xc0000000c0000000 | uVar14;
        }
        else {
          if (pGVar10 + iVar23 <= pGVar11 || pGVar11 < pGVar10) goto LAB_002bd716;
          uVar15 = (ulong)(((uint)(iVar16 - (int)pGVar10) >> 2) * -0x55555555 - uVar13 & 0x1fffffff)
                   << 0x20;
          uVar12 = *(ulong *)pGVar11;
          uVar20 = (ulong)(uVar21 & 1) << 0x3d;
          *(ulong *)pGVar11 = uVar20 | uVar12 & 0xc0000000ffffffff | uVar15;
          pGVar10 = p->pObjs;
          if ((pGVar11 < pGVar10) || (pGVar10 + p->nObjs <= pGVar11)) goto LAB_002bd716;
          uVar14 = (ulong)(((uint)(iVar16 - (int)pGVar10) >> 2) * -0x55555555 - uVar5 & 0x1fffffff);
          *(ulong *)pGVar11 = uVar20 | uVar12 & 0xc0000000e0000000 | uVar15 | uVar14;
          uVar19 = (ulong)((uVar18 & 1) << 0x1d);
          uVar14 = uVar20 | uVar12 & 0xc0000000c0000000 | uVar15 | uVar14;
        }
        *(ulong *)pGVar11 = uVar14 | uVar19;
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pGVar11 + -(uVar14 & 0x1fffffff),pGVar11);
          Gia_ObjAddFanout(p,pGVar11 + -((ulong)*(uint *)&pGVar11->field_0x4 & 0x1fffffff),pGVar11);
        }
        if (p->fSweeper != 0) {
          uVar15 = *(ulong *)pGVar11 & 0x1fffffff;
          uVar12 = *(ulong *)pGVar11 >> 0x20 & 0x1fffffff;
          uVar20 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar11 + -uVar15) >> 0x1e & 1) == 0) {
            uVar20 = 0x40000000;
          }
          *(ulong *)(pGVar11 + -uVar15) = uVar20 | *(ulong *)(pGVar11 + -uVar15);
          uVar20 = *(ulong *)(pGVar11 + -uVar12);
          uVar14 = 0x4000000000000000;
          if (((uint)uVar20 >> 0x1e & 1) == 0) {
            uVar14 = 0x40000000;
          }
          *(ulong *)(pGVar11 + -uVar12) = uVar14 | uVar20;
          uVar12 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 =
               uVar12 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar12 >> 0x3d) ^ (uint)(uVar20 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar11 + -uVar15) >> 0x3f) ^
                      (uint)(uVar12 >> 0x1d) & 7)) << 0x3f;
        }
        if (p->fBuiltInSim != 0) {
          uVar12 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 =
               uVar12 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar12 >> 0x3d) ^
                       (uint)((ulong)*(undefined8 *)(pGVar11 + -(uVar12 >> 0x20 & 0x1fffffff)) >>
                             0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar11 + -(uVar12 & 0x1fffffff)) >> 0x3f) ^
                      (uint)(uVar12 >> 0x1d) & 7)) << 0x3f;
          pGVar10 = p->pObjs;
          if ((pGVar11 < pGVar10) || (pGVar10 + p->nObjs <= pGVar11)) goto LAB_002bd716;
          Gia_ManBuiltInSimPerform
                    (p,(int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * -0x55555555);
        }
        if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
          Gia_ManQuantSetSuppAnd(p,pGVar11);
        }
        pGVar10 = p->pObjs;
        if ((pGVar11 < pGVar10) || (pGVar10 + p->nObjs <= pGVar11)) goto LAB_002bd716;
        uVar21 = (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * 0x55555556;
        if ((~bVar2 & 3) == 0) {
          if ((*pbVar22 & 4) == 0) {
            __assert_fail("( *p >> 2 ) & 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                          ,0x751,"Gia_Man_t *Ses_ManExtractGia(const char *)");
          }
          if ((int)uVar21 < 0) goto LAB_002bd7b1;
          uVar21 = uVar21 | 1;
        }
        Vec_IntPush(p_00,uVar21);
        pbVar22 = pbVar22 + 4;
        iVar4 = iVar4 + 1;
      } while (iVar4 < __ptr[2]);
    }
    iVar23 = (int)__ptr[1];
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    iVar4 = 8;
    if (6 < iVar23 - 1U) {
      iVar4 = iVar23;
    }
    pVVar8->nSize = 0;
    pVVar8->nCap = iVar4;
    if (iVar4 == 0) {
      ppvVar9 = (void **)0x0;
    }
    else {
      ppvVar9 = (void **)malloc((long)iVar4 << 3);
    }
    pVVar8->pArray = ppvVar9;
    pVVar8->nSize = iVar23;
    iVar4 = 0;
    memset(ppvVar9,0,(long)iVar23 << 3);
    p->vNamesOut = pVVar8;
    if ('\0' < __ptr[1]) {
      do {
        bVar2 = *pbVar22;
        if ((char)bVar2 < '\0') {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar21 = ((uint)(int)(char)bVar2 >> 1) + (int)*__ptr;
        if (((int)uVar21 < 0) || (p_00->nSize <= (int)uVar21)) {
LAB_002bd735:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar21 = p_00->pArray[uVar21];
        if (((int)(char)bVar2 & 1U) != 0) {
          if ((int)uVar21 < 0) {
LAB_002bd7b1:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          uVar21 = uVar21 ^ 1;
        }
        if (((int)uVar21 < 0) || (uVar18 = uVar21 >> 1, p->nObjs <= (int)uVar18)) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(p->pObjs + uVar18) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p->pObjs + uVar18) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar10 = Gia_ManAppendObj(p);
        uVar12 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar12 | 0x80000000;
        pGVar11 = p->pObjs;
        if ((pGVar10 < pGVar11) || (pGVar11 + p->nObjs <= pGVar10)) {
LAB_002bd716:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar15 = (ulong)(((uint)((int)pGVar10 - (int)pGVar11) >> 2) * -0x55555555 - uVar18 &
                        0x1fffffff);
        uVar20 = (ulong)((uVar21 & 1) << 0x1d);
        *(ulong *)pGVar10 = uVar20 | uVar12 & 0xffffffffc0000000 | 0x80000000 | uVar15;
        *(ulong *)pGVar10 =
             uVar20 | uVar12 & 0xe0000000c0000000 | 0x80000000 | uVar15 |
             (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar11 = p->pObjs;
        if ((pGVar10 < pGVar11) || (pGVar11 + p->nObjs <= pGVar10)) goto LAB_002bd716;
        Vec_IntPush(p->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2) * -0x55555555);
        if (p->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar10);
        }
        if ((pGVar10 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar10)) goto LAB_002bd716;
        uVar21 = *__ptr + iVar4;
        if (((int)uVar21 < 0) || (vNames->nSize <= (int)uVar21)) {
LAB_002bd754:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pVVar8 = p->vNamesOut;
        pcVar6 = Extra_UtilStrsav((char *)vNames->pArray[uVar21]);
        Vec_PtrSetEntry(pVVar8,iVar4,pcVar6);
        pbVar22 = pbVar22 + (long)*__ptr + 2;
        iVar4 = iVar4 + 1;
      } while (iVar4 < __ptr[1]);
    }
    Abc_NodeFreeNames(vNames);
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
      p_00->pArray = (int *)0x0;
    }
    free(p_00);
    free(__ptr);
  }
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pSes->timeTotal = lVar17 + local_58;
  if (fVerbose != 0) {
    Ses_ManPrintRuntime(pSes);
  }
  if (pSes->pSat != (sat_solver *)0x0) {
    sat_solver_delete(pSes->pSat);
  }
  Ses_ManCleanLight(pSes);
  return p;
}

Assistant:

Gia_Man_t * Gia_ManFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int nBTLimit, int nStartGates, int fVerbose )
{
    Ses_Man_t * pSes;
    char * pSol;
    Gia_Man_t * pGia = NULL;
    abctime timeStart;

    /* some checks */
    assert( nVars >= 2 && nVars <= 8 );

    timeStart = Abc_Clock();

    pSes = Ses_ManAlloc( pTruth, nVars, nFunc, nMaxDepth, pArrTimeProfile, 1, nBTLimit, fVerbose );
    pSes->nStartGates = nStartGates;
    pSes->fVeryVerbose = 1;
    pSes->fExtractVerbose = 0;
    pSes->fSatVerbose = 0;
    pSes->fReasonVerbose = 1;
    if ( fVerbose )
        Ses_ManPrintFuncs( pSes );

    if ( ( pSol = Ses_ManFindMinimumSize( pSes ) ) != NULL )
    {
        pGia = Ses_ManExtractGia( pSol );
        ABC_FREE( pSol );
    }

    pSes->timeTotal = Abc_Clock() - timeStart;

    if ( fVerbose )
        Ses_ManPrintRuntime( pSes );

    /* cleanup */
    Ses_ManClean( pSes );

    return pGia;
}